

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O3

vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
helics::InterfaceInfo::checkInterfacesForIssues_abi_cxx11_
          (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,InterfaceInfo *this)

{
  unique_lock<std::shared_mutex> *this_00;
  int iVar1;
  pointer psVar2;
  pointer puVar3;
  pointer puVar4;
  bool bVar5;
  InputInfo *pIVar6;
  PublicationInfo *pPVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *ept;
  pointer puVar11;
  pointer puVar12;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string *unit2;
  pointer psVar15;
  pointer puVar16;
  InterfaceInfo *pIVar17;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view type2;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  string_view type1;
  handle ehandle;
  handle phandle;
  handle ihandle;
  Errors local_dc;
  string local_d8;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  char *local_98;
  size_type sStack_90;
  ulong local_88;
  shared_guarded<gmlc::containers::DualMappedPointerVector<PublicationInfo,_std::string,_InterfaceHandle>_>
  *local_70;
  unique_lock<std::shared_mutex> local_68;
  InterfaceInfo *local_58;
  shared_guarded<gmlc::containers::DualMappedPointerVector<InputInfo,_std::string,_InterfaceHandle>_>
  *local_50;
  unique_lock<std::shared_mutex> local_48;
  pointer local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = &this->inputs;
  local_48._M_device = &(this->inputs).m_mutex;
  local_48._M_owns = false;
  std::unique_lock<std::shared_mutex>::lock(&local_48);
  local_48._M_owns = true;
  puVar11 = (local_50->m_obj).dataStorage.
            super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (local_50->m_obj).dataStorage.
             super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = this;
  if (puVar11 == local_38) {
LAB_0031b7f5:
    pIVar17 = local_58;
    local_50 = (shared_guarded<gmlc::containers::DualMappedPointerVector<InputInfo,_std::string,_InterfaceHandle>_>
                *)0x0;
    std::unique_lock<std::shared_mutex>::unlock(&local_48);
  }
  else {
    do {
      pIVar6 = (puVar11->_M_t).
               super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>.
               _M_t.
               super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>.
               super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl;
      if ((pIVar6->required == true) && (pIVar6->has_target == false)) {
        local_70 = (shared_guarded<gmlc::containers::DualMappedPointerVector<PublicationInfo,_std::string,_InterfaceHandle>_>
                    *)CONCAT44(local_70._4_4_,0xfffffffe);
        local_d8._M_dataplus._M_p = (pIVar6->key)._M_dataplus._M_p;
        local_d8._M_string_length = (pIVar6->key)._M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x2a;
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)&local_d8;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)local_b8,(v11 *)"Input {} is required but has no connection",fmt,args);
        std::
        vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
        ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                  ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                    *)__return_storage_ptr__,(Errors *)&local_70,(string *)local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._0_8_ != &local_a8) {
          operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._M_allocated_capacity + 1));
        }
        pIVar6 = (puVar11->_M_t).
                 super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>
                 .super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl;
      }
      iVar1 = pIVar6->required_connnections;
      uVar8 = (ulong)iVar1;
      if ((0 < (long)uVar8) &&
         (uVar9 = (long)*(pointer *)
                         ((long)&(pIVar6->input_sources).
                                 super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                                 ._M_impl + 8) -
                  *(long *)&(pIVar6->input_sources).
                            super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                            ._M_impl.super__Vector_impl_data >> 3, uVar9 != uVar8)) {
        if (iVar1 == 1) {
          local_70 = (shared_guarded<gmlc::containers::DualMappedPointerVector<PublicationInfo,_std::string,_InterfaceHandle>_>
                      *)CONCAT44(local_70._4_4_,0xfffffffe);
          local_d8._M_dataplus._M_p = (pIVar6->key)._M_dataplus._M_p;
          local_d8._M_string_length = (pIVar6->key)._M_string_length;
          fmt_00.size_ = 0xd;
          fmt_00.data_ = (char *)0x3f;
          args_00.field_1.values_ = in_R9.values_;
          args_00.desc_ = (unsigned_long_long)&local_d8;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)local_b8,
                     (v11 *)"Input {} is single source only but has more than one connection",fmt_00
                     ,args_00);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                    ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      *)__return_storage_ptr__,(Errors *)&local_70,(string *)local_b8);
          uVar13 = local_a8._M_allocated_capacity;
          _Var14._M_p = (pointer)local_b8._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._0_8_ != &local_a8) {
LAB_0031b65d:
            operator_delete(_Var14._M_p,(ulong)(uVar13 + 1));
          }
        }
        else {
          local_70 = (shared_guarded<gmlc::containers::DualMappedPointerVector<PublicationInfo,_std::string,_InterfaceHandle>_>
                      *)CONCAT44(local_70._4_4_,0xfffffffe);
          local_98 = "";
          if (uVar9 < uVar8) {
            local_98 = " only";
          }
          local_b8._0_8_ = (pIVar6->key)._M_dataplus._M_p;
          local_b8._8_8_ = (pIVar6->key)._M_string_length;
          local_a8._M_allocated_capacity._0_4_ = iVar1;
          fmt_01.size_ = 0x4c1d;
          fmt_01.data_ = (char *)0x33;
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)local_b8;
          local_88 = uVar9;
          ::fmt::v11::vformat_abi_cxx11_
                    (&local_d8,(v11 *)"Input {} requires {} connections but{} {} were made",fmt_01,
                     args_01);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                    ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      *)__return_storage_ptr__,(Errors *)&local_70,&local_d8);
          uVar13 = local_d8.field_2._M_allocated_capacity;
          _Var14._M_p = local_d8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) goto LAB_0031b65d;
        }
      }
      pIVar6 = (puVar11->_M_t).
               super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>.
               _M_t.
               super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>.
               super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl;
      psVar15 = *(pointer *)
                 &(pIVar6->source_info).
                  super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                  ._M_impl;
      psVar2 = *(pointer *)
                ((long)&(pIVar6->source_info).
                        super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                + 8);
      if (psVar15 != psVar2) {
        unit2 = &psVar15->units;
        do {
          pIVar6 = (puVar11->_M_t).
                   super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>
                   .super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl;
          type2._M_str = unit2[-1]._M_dataplus._M_p;
          type2._M_len = unit2[-1]._M_string_length;
          type1._M_str = (pIVar6->type)._M_dataplus._M_p;
          type1._M_len = (pIVar6->type)._M_string_length;
          bVar5 = checkTypeMatch(type1,type2,pIVar6->strict_type_matching);
          if (!bVar5) {
            local_70 = (shared_guarded<gmlc::containers::DualMappedPointerVector<PublicationInfo,_std::string,_InterfaceHandle>_>
                        *)CONCAT44(local_70._4_4_,0xfffffffe);
            pIVar6 = (puVar11->_M_t).
                     super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>
                     .super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl;
            local_b8._0_8_ = (pIVar6->key)._M_dataplus._M_p;
            local_b8._8_8_ = (pIVar6->key)._M_string_length;
            local_a8._M_allocated_capacity = (size_type)(pIVar6->type)._M_dataplus._M_p;
            local_a8._8_8_ = (pIVar6->type)._M_string_length;
            local_98 = unit2[-1]._M_dataplus._M_p;
            sStack_90 = unit2[-1]._M_string_length;
            fmt_02.size_ = 0xddd;
            fmt_02.data_ = (char *)0x44;
            args_02.field_1.values_ = in_R9.values_;
            args_02.desc_ = (unsigned_long_long)local_b8;
            ::fmt::v11::vformat_abi_cxx11_
                      (&local_d8,
                       (v11 *)
                       "Input \"{}\" source has mismatched types: {} is not compatible with {}",
                       fmt_02,args_02);
            std::
            vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
            ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                      ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                        *)__return_storage_ptr__,(Errors *)&local_70,&local_d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              (ulong)(local_d8.field_2._M_allocated_capacity + 1));
            }
          }
          pIVar6 = (puVar11->_M_t).
                   super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>
                   .super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl;
          if ((pIVar6->ignore_unit_mismatch == false) &&
             (bVar5 = checkUnitMatch(&pIVar6->units,unit2,false), !bVar5)) {
            local_70 = (shared_guarded<gmlc::containers::DualMappedPointerVector<PublicationInfo,_std::string,_InterfaceHandle>_>
                        *)CONCAT44(local_70._4_4_,0xfffffffe);
            pIVar6 = (puVar11->_M_t).
                     super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>
                     .super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl;
            local_b8._0_8_ = (pIVar6->key)._M_dataplus._M_p;
            local_b8._8_8_ = (pIVar6->key)._M_string_length;
            local_a8._M_allocated_capacity = (size_type)(unit2->_M_dataplus)._M_p;
            local_a8._8_8_ = unit2->_M_string_length;
            local_98 = (pIVar6->units)._M_dataplus._M_p;
            sStack_90 = (pIVar6->units)._M_string_length;
            fmt_03.size_ = 0xddd;
            fmt_03.data_ = (char *)0x44;
            args_03.field_1.values_ = in_R9.values_;
            args_03.desc_ = (unsigned_long_long)local_b8;
            ::fmt::v11::vformat_abi_cxx11_
                      (&local_d8,
                       (v11 *)
                       "Input \"{}\" source has incompatible unit: {} is not convertible to {}",
                       fmt_03,args_03);
            std::
            vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
            ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                      ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                        *)__return_storage_ptr__,(Errors *)&local_70,&local_d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              (ulong)(local_d8.field_2._M_allocated_capacity + 1));
            }
          }
          psVar15 = (pointer)(unit2 + 1);
          unit2 = unit2 + 3;
        } while (psVar15 != psVar2);
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 != local_38);
    local_50 = (shared_guarded<gmlc::containers::DualMappedPointerVector<InputInfo,_std::string,_InterfaceHandle>_>
                *)0x0;
    pIVar17 = local_58;
    if ((local_48._M_owns & 1U) != 0) goto LAB_0031b7f5;
  }
  local_70 = &pIVar17->publications;
  local_68._M_device = &(pIVar17->publications).m_mutex;
  local_68._M_owns = false;
  std::unique_lock<std::shared_mutex>::lock(&local_68);
  local_68._M_owns = true;
  puVar16 = (local_70->m_obj).dataStorage.
            super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (local_70->m_obj).dataStorage.
           super__Vector_base<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar16 == puVar3) {
LAB_0031b9ee:
    local_70 = (shared_guarded<gmlc::containers::DualMappedPointerVector<PublicationInfo,_std::string,_InterfaceHandle>_>
                *)0x0;
    std::unique_lock<std::shared_mutex>::unlock(&local_68);
  }
  else {
    do {
      pPVar7 = (puVar16->_M_t).
               super___uniq_ptr_impl<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>
               .super__Head_base<0UL,_helics::PublicationInfo_*,_false>._M_head_impl;
      if ((pPVar7->required == true) &&
         (*(pointer *)
           &(pPVar7->subscribers).
            super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
            ._M_impl ==
          *(pointer *)
           ((long)&(pPVar7->subscribers).
                   super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
           + 8))) {
        local_dc = CONNECTION_FAILURE;
        local_d8._M_dataplus._M_p = (pPVar7->key)._M_dataplus._M_p;
        local_d8._M_string_length = (pPVar7->key)._M_string_length;
        fmt_04.size_ = 0xd;
        fmt_04.data_ = (char *)0x31;
        args_04.field_1.values_ = in_R9.values_;
        args_04.desc_ = (unsigned_long_long)&local_d8;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)local_b8,(v11 *)"Publication {} is required but has no subscribers",
                   fmt_04,args_04);
        std::
        vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
        ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                  ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                    *)__return_storage_ptr__,&local_dc,(string *)local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._0_8_ != &local_a8) {
          operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._M_allocated_capacity + 1));
        }
        pPVar7 = (puVar16->_M_t).
                 super___uniq_ptr_impl<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>
                 .super__Head_base<0UL,_helics::PublicationInfo_*,_false>._M_head_impl;
      }
      iVar1 = pPVar7->requiredConnections;
      if ((0 < (long)iVar1) &&
         (pcVar10 = (char *)(((long)*(pointer *)
                                     ((long)&(pPVar7->subscribers).
                                             super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                                             ._M_impl + 8) -
                              *(long *)&(pPVar7->subscribers).
                                        super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                                        ._M_impl.super__Vector_impl_data >> 3) * -0x3333333333333333
                            ), (long)pcVar10 - (long)iVar1 != 0)) {
        if (iVar1 == 1) {
          local_dc = CONNECTION_FAILURE;
          local_d8._M_dataplus._M_p = (pPVar7->key)._M_dataplus._M_p;
          local_d8._M_string_length = (pPVar7->key)._M_string_length;
          fmt_05.size_ = 0xd;
          fmt_05.data_ = (char *)0x45;
          args_05.field_1.values_ = in_R9.values_;
          args_05.desc_ = (unsigned_long_long)&local_d8;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)local_b8,
                     (v11 *)"Publication {} is single source only but has more than one connection",
                     fmt_05,args_05);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                    ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      *)__return_storage_ptr__,&local_dc,(string *)local_b8);
          uVar13 = local_a8._M_allocated_capacity;
          _Var14._M_p = (pointer)local_b8._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._0_8_ != &local_a8) {
LAB_0031b9ab:
            operator_delete(_Var14._M_p,(ulong)(uVar13 + 1));
          }
        }
        else {
          local_dc = CONNECTION_FAILURE;
          local_b8._0_8_ = (pPVar7->key)._M_dataplus._M_p;
          local_b8._8_8_ = (pPVar7->key)._M_string_length;
          local_a8._M_allocated_capacity._0_4_ = iVar1;
          fmt_06.size_ = 0x41d;
          fmt_06.data_ = &DAT_0000003b;
          args_06.field_1.values_ = in_R9.values_;
          args_06.desc_ = (unsigned_long_long)local_b8;
          local_98 = pcVar10;
          ::fmt::v11::vformat_abi_cxx11_
                    (&local_d8,(v11 *)"Publication {} requires {} connections but only {} are made",
                     fmt_06,args_06);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                    ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      *)__return_storage_ptr__,&local_dc,&local_d8);
          uVar13 = local_d8.field_2._M_allocated_capacity;
          _Var14._M_p = local_d8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) goto LAB_0031b9ab;
        }
      }
      puVar16 = puVar16 + 1;
    } while (puVar16 != puVar3);
    local_70 = (shared_guarded<gmlc::containers::DualMappedPointerVector<PublicationInfo,_std::string,_InterfaceHandle>_>
                *)0x0;
    pIVar17 = local_58;
    if ((local_68._M_owns & 1U) != 0) goto LAB_0031b9ee;
  }
  local_b8._0_8_ = &pIVar17->endpoints;
  local_b8._8_8_ = &(pIVar17->endpoints).m_mutex;
  this_00 = (unique_lock<std::shared_mutex> *)(local_b8 + 8);
  local_a8._M_allocated_capacity = local_a8._M_allocated_capacity & 0xffffffffffffff00;
  std::unique_lock<std::shared_mutex>::lock(this_00);
  local_a8._M_local_buf[0] = 1;
  puVar12 = *(pointer *)local_b8._0_8_;
  puVar4 = *(pointer *)(local_b8._0_8_ + 8);
  if (puVar12 != puVar4) {
    do {
      EndpointInfo::checkInterfacesForIssues
                ((puVar12->_M_t).
                 super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                 .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl,
                 __return_storage_ptr__);
      puVar12 = puVar12 + 1;
    } while (puVar12 != puVar4);
    local_b8._0_8_ = (pointer)0x0;
    if ((local_a8._M_allocated_capacity & 1) == 0) goto LAB_0031ba6b;
  }
  local_b8._0_8_ = (pointer)0x0;
  std::unique_lock<std::shared_mutex>::unlock(this_00);
LAB_0031ba6b:
  std::unique_lock<std::shared_mutex>::~unique_lock(this_00);
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_68);
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<int, std::string>> InterfaceInfo::checkInterfacesForIssues()
{
    std::vector<std::pair<int, std::string>> issues;
    auto ihandle = inputs.lock();
    for (const auto& ipt : ihandle) {
        if (ipt->required) {
            if (!ipt->has_target) {
                issues.emplace_back(helics::defs::Errors::CONNECTION_FAILURE,
                                    fmt::format("Input {} is required but has no connection",
                                                ipt->key));
            }
        }
        if (ipt->required_connnections > 0) {
            if (ipt->input_sources.size() != static_cast<size_t>(ipt->required_connnections)) {
                if (ipt->required_connnections == 1) {
                    issues.emplace_back(
                        helics::defs::Errors::CONNECTION_FAILURE,
                        fmt::format(
                            "Input {} is single source only but has more than one connection",
                            ipt->key));
                } else {
                    issues.emplace_back(
                        helics::defs::Errors::CONNECTION_FAILURE,
                        fmt::format("Input {} requires {} connections but{} {} were made",
                                    ipt->key,
                                    ipt->required_connnections,
                                    (ipt->input_sources.size() <
                                     static_cast<size_t>(ipt->required_connnections)) ?
                                        " only" :
                                        "",
                                    ipt->input_sources.size()));
                }
            }
        }
        for (auto& source : ipt->source_info) {
            if (!checkTypeMatch(ipt->type, source.type, ipt->strict_type_matching)) {
                issues.emplace_back(
                    helics::defs::Errors::CONNECTION_FAILURE,
                    fmt::format(
                        "Input \"{}\" source has mismatched types: {} is not compatible with {}",
                        ipt->key,
                        ipt->type,
                        source.type));
            }
            if ((!ipt->ignore_unit_mismatch) &&
                (!checkUnitMatch(ipt->units, source.units, false))) {
                issues.emplace_back(
                    helics::defs::Errors::CONNECTION_FAILURE,
                    fmt::format(
                        "Input \"{}\" source has incompatible unit: {} is not convertible to {}",
                        ipt->key,
                        source.units,
                        ipt->units));
            }
        }
    }
    ihandle.unlock();
    auto phandle = publications.lock();
    for (const auto& pub : phandle) {
        if (pub->required) {
            if (pub->subscribers.empty()) {
                issues.emplace_back(helics::defs::Errors::CONNECTION_FAILURE,
                                    fmt::format("Publication {} is required but has no subscribers",
                                                pub->key));
            }
        }
        if (pub->requiredConnections > 0) {
            if (pub->subscribers.size() != static_cast<size_t>(pub->requiredConnections)) {
                if (pub->requiredConnections == 1) {
                    issues.emplace_back(
                        helics::defs::Errors::CONNECTION_FAILURE,
                        fmt::format(
                            "Publication {} is single source only but has more than one connection",
                            pub->key));
                } else {
                    issues.emplace_back(
                        helics::defs::Errors::CONNECTION_FAILURE,
                        fmt::format("Publication {} requires {} connections but only {} are made",
                                    pub->key,
                                    pub->requiredConnections,
                                    pub->subscribers.size()));
                }
            }
        }
    }
    phandle.unlock();
    auto ehandle = endpoints.lock();
    for (const auto& ept : ehandle) {
        ept->checkInterfacesForIssues(issues);
    }
    ehandle.unlock();
    return issues;
}